

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O3

HPDF_XrefEntry HPDF_Xref_GetEntryByObjectId(HPDF_Xref xref,HPDF_UINT obj_id)

{
  HPDF_Xref *pp_Var1;
  HPDF_UINT HVar2;
  uint uVar3;
  HPDF_XrefEntry p_Var4;
  HPDF_UINT index;
  HPDF_Xref p_Var5;
  
  p_Var5 = xref;
  if (xref != (HPDF_Xref)0x0) {
    do {
      HVar2 = p_Var5->entries->count;
      uVar3 = p_Var5->start_offset;
      if (obj_id < uVar3 + HVar2) {
        HPDF_SetError(xref->error,0x1034,0);
        return (HPDF_XrefEntry)0x0;
      }
      if (HVar2 != 0 && uVar3 < obj_id) {
        index = 0;
        do {
          if (obj_id - uVar3 == index) {
            p_Var4 = (HPDF_XrefEntry)HPDF_List_ItemAt(p_Var5->entries,index);
            return p_Var4;
          }
          index = index + 1;
        } while (HVar2 != index);
      }
      pp_Var1 = &p_Var5->prev;
      p_Var5 = *pp_Var1;
    } while (*pp_Var1 != (HPDF_Xref)0x0);
  }
  return (HPDF_XrefEntry)0x0;
}

Assistant:

HPDF_XrefEntry
HPDF_Xref_GetEntryByObjectId  (HPDF_Xref  xref,
                               HPDF_UINT  obj_id)
{
    HPDF_Xref tmp_xref = xref;

    HPDF_PTRACE((" HPDF_Xref_GetEntryByObjectId\n"));

    while (tmp_xref) {
        HPDF_UINT i;

        if (tmp_xref->entries->count + tmp_xref->start_offset > obj_id) {
            HPDF_SetError (xref->error, HPDF_INVALID_OBJ_ID, 0);
            return NULL;
        }

        if (tmp_xref->start_offset < obj_id) {
            for (i = 0; i < tmp_xref->entries->count; i++) {
                if (tmp_xref->start_offset + i == obj_id) {
                    HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

                    return entry;
                }
            }
        }

        tmp_xref = tmp_xref->prev;
    }

    return NULL;
}